

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase793::run(TestCase793 *this)

{
  StructDataBitCount *this_00;
  bool bVar1;
  ArrayPtr<const_capnp::word> *pAVar2;
  size_t sVar3;
  Reader value;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar4;
  Builder local_218;
  bool local_1f9;
  undefined1 local_1f8 [7];
  bool _kj_shouldLog_2;
  bool local_1d9;
  undefined1 local_1d8 [7];
  bool _kj_shouldLog_1;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> local_1b8;
  size_t local_1a8;
  uint local_1a0;
  bool local_199;
  undefined1 auStack_198 [7];
  bool _kj_shouldLog;
  size_t local_190;
  ArrayPtr<const_char> local_188;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> local_178;
  word *local_168;
  word *zerosEnd;
  size_t local_158;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> local_150;
  word *local_140;
  word *zerosStart;
  undefined1 local_128 [8];
  Builder root;
  MallocMessageBuilder builder;
  TestCase793 *this_local;
  
  this_00 = &root._builder.dataSize;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            ((Builder *)local_128,(MessageBuilder *)this_00);
  local_150 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&root._builder.dataSize);
  pAVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[](&local_150,0);
  local_140 = kj::ArrayPtr<const_capnp::word>::end(pAVar2);
  value = _::data("abcd123");
  local_158 = value.super_ArrayPtr<const_unsigned_char>.size_;
  zerosEnd = (word *)value.super_ArrayPtr<const_unsigned_char>.ptr;
  capnproto_test::capnp::test::TestAllTypes::Builder::setDataField((Builder *)local_128,value);
  local_178 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&root._builder.dataSize);
  pAVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[](&local_178,0);
  local_168 = kj::ArrayPtr<const_capnp::word>::end(pAVar2);
  Text::Reader::Reader((Reader *)&local_188,"foo");
  capnproto_test::capnp::test::TestAllTypes::Builder::setTextField
            ((Builder *)local_128,(Reader)local_188);
  _auStack_198 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&root._builder.dataSize);
  sVar3 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                    ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)auStack_198);
  if (sVar3 != 1) {
    local_199 = kj::_::Debug::shouldLog(ERROR);
    while (local_199 != false) {
      local_1a0 = 1;
      AVar4 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&root._builder.dataSize);
      local_1b8 = AVar4;
      local_1a8 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size(&local_1b8);
      kj::_::Debug::log<char_const(&)[65],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x323,ERROR,
                 "\"failed: expected \" \"(1u) == (builder.getSegmentsForOutput().size())\", 1u, builder.getSegmentsForOutput().size()"
                 ,(char (*) [65])"failed: expected (1u) == (builder.getSegmentsForOutput().size())",
                 &local_1a0,&local_1a8);
      local_199 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::disownDataField
            ((Orphan<capnp::Data> *)local_1d8,(Builder *)local_128);
  Orphan<capnp::Data>::~Orphan((Orphan<capnp::Data> *)local_1d8);
  bVar1 = allZero(local_140,local_168);
  if (!bVar1) {
    local_1d9 = kj::_::Debug::shouldLog(ERROR);
    while (local_1d9 != false) {
      kj::_::Debug::log<char_const(&)[47]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x327,ERROR,"\"failed: expected \" \"allZero(zerosStart, zerosEnd)\"",
                 (char (*) [47])"failed: expected allZero(zerosStart, zerosEnd)");
      local_1d9 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getTextField
            ((Builder *)local_1f8,(Builder *)local_128);
  bVar1 = capnp::operator==("foo",(Builder *)local_1f8);
  if (!bVar1) {
    local_1f9 = kj::_::Debug::shouldLog(ERROR);
    while (local_1f9 != false) {
      capnproto_test::capnp::test::TestAllTypes::Builder::getTextField
                (&local_218,(Builder *)local_128);
      kj::_::Debug::log<char_const(&)[50],char_const(&)[4],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x329,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (root.getTextField())\", \"foo\", root.getTextField()"
                 ,(char (*) [50])"failed: expected (\"foo\") == (root.getTextField())",
                 (char (*) [4])"foo",&local_218);
      local_1f9 = false;
    }
  }
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root._builder.dataSize);
  return;
}

Assistant:

TEST(Orphans, DataZerodAfterUse) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<TestAllTypes>();

  const word* zerosStart = builder.getSegmentsForOutput()[0].end();
  root.setDataField(data("abcd123"));
  const word* zerosEnd = builder.getSegmentsForOutput()[0].end();

  root.setTextField("foo");  // guard against overruns

  EXPECT_EQ(1u, builder.getSegmentsForOutput().size());  // otherwise test is invalid

  root.disownDataField();

  EXPECT_TRUE(allZero(zerosStart, zerosEnd));

  EXPECT_EQ("foo", root.getTextField());
}